

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeSimilarFunctions.cpp
# Opt level: O3

bool __thiscall
wasm::EquivalentClass::hasMergeBenefit
          (EquivalentClass *this,Module *module,
          vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *params)

{
  Index IVar1;
  size_t sVar2;
  long lVar3;
  Signature SVar4;
  Type local_30;
  
  lVar3 = (long)(this->functions).
                super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->functions).
                super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  IVar1 = Measurer::measure(this->primaryFunction->body);
  SVar4 = HeapType::getSignature(&this->primaryFunction->type);
  local_30 = SVar4.params.id;
  sVar2 = wasm::Type::size(&local_30);
  return (sVar2 + ((long)(params->
                         super__Vector_base<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(params->
                         super__Vector_base<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>).
                         _M_impl.super__Vector_impl_data._M_start >> 3) * 0x5d1745d1745d1746 + 5) *
         lVar3 < (ulong)IVar1 * (lVar3 + -1);
}

Assistant:

bool EquivalentClass::hasMergeBenefit(Module* module,
                                      const std::vector<ParamInfo>& params) {
  size_t funcCount = functions.size();
  Index exprSize = Measurer::measure(primaryFunction->body);
  size_t thunkCount = funcCount;
  // -1 for cloned primary func
  size_t removedInstrs = (funcCount - 1) * exprSize;
  // Each thunks will add local.get and call instructions to forward the params
  // and pass extra parameterized values.
  size_t addedInstrsPerThunk =
    thunkCount * (
                   // call
                   1 +
                   // local.get
                   primaryFunction->getParams().size() + params.size());

  constexpr size_t INSTR_WEIGHT = 1;
  constexpr size_t CODE_SEC_LOCALS_WEIGHT = 1;
  constexpr size_t CODE_SEC_ENTRY_WEIGHT = 2;
  constexpr size_t FUNC_SEC_ENTRY_WEIGHT = 2;

  // Glue instrs for thunks and a merged function entry will be added by the
  // merge.
  size_t negativeScore =
    addedInstrsPerThunk * INSTR_WEIGHT +
    thunkCount * (
                   // Locals entries in merged function in code section.
                   (params.size() * CODE_SEC_LOCALS_WEIGHT) +
                   // Code size field in merged function entry.
                   CODE_SEC_ENTRY_WEIGHT) +
    // Thunk function entries in function section.
    (thunkCount * FUNC_SEC_ENTRY_WEIGHT);
  size_t positiveScore = INSTR_WEIGHT * removedInstrs;
  return negativeScore < positiveScore;
}